

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O1

bool __thiscall GPIO::DigitalIn::debounce(DigitalIn *this)

{
  unsigned_long *puVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  timespec local_38;
  
  puVar1 = GPIOBase::gpio_addr;
  uVar5 = (ulong)(this->m_pin >> 5);
  GPIOBase::gpio_addr[uVar5 + 0xd] =
       GPIOBase::gpio_addr[uVar5 + 0xd] & (long)(1 << ((byte)this->m_pin & 0x1f));
  if (((this->m_pullupdown != UP ^ this->m_state ^ puVar1[uVar5 + 0xd] != 0) & 1U) == 0) {
    if ((this->m_min_trigger_interval).__r == 0) {
      return true;
    }
    lVar3 = std::chrono::_V2::steady_clock::now();
    if ((this->m_min_trigger_interval).__r <= lVar3 - (this->m_last_triggered).__d.__r) {
      local_38.tv_nsec = (this->m_min_hold_interval).__r;
      if (0 < local_38.tv_nsec) {
        local_38.tv_sec = (ulong)local_38.tv_nsec / 1000000000;
        local_38.tv_nsec = (ulong)local_38.tv_nsec % 1000000000;
        do {
          iVar2 = nanosleep(&local_38,&local_38);
          if (iVar2 != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        puVar1 = GPIOBase::gpio_addr;
        uVar5 = (ulong)(this->m_pin >> 5);
        GPIOBase::gpio_addr[uVar5 + 0xd] =
             GPIOBase::gpio_addr[uVar5 + 0xd] & (long)(1 << ((byte)this->m_pin & 0x1f));
        if (((this->m_pullupdown != UP ^ this->m_state ^ puVar1[uVar5 + 0xd] != 0) & 1U) != 0) {
          return false;
        }
      }
      (this->m_last_triggered).__d.__r = lVar3;
      this->m_state = (bool)(this->m_state ^ 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool DigitalIn::debounce()
{
    // check if the input has the expected state

    if (m_gpio.read(m_pin) != ((m_pullupdown != GPIO_PULL::UP) ? !m_state : m_state)) return false;
    
    // is this a truly perfect digital 0 1 input? Then do not debounce..

    if (m_min_trigger_interval.count() == 0) return true;
    
    auto now = std::chrono::steady_clock::now();
    if ((now - m_last_triggered) < m_min_trigger_interval) return false;

    if (m_min_hold_interval.count() > 0) {

        // sleep a wink

        std::this_thread::sleep_for(m_min_hold_interval);
    
        // and check if the pin is still triggered (pin is 0 if pulldown and switch closed, otherwise 1

        if (m_gpio.read(m_pin) != ((m_pullupdown != GPIO_PULL::UP) ? !m_state : m_state)) return false;
    }
    
    // finally assign this event as the last trigger

    m_last_triggered = now;
    
    // toggle state

    m_state = !m_state;
    
    // and return success

    return true;
}